

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

void __thiscall
Js::ConcatStringBuilder::CopyVirtual
          (ConcatStringBuilder *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  JavascriptString *this_00;
  code *pcVar1;
  StringCopyInfo copyInfo;
  bool bVar2;
  charcount_t cVar3;
  uint uVar4;
  charcount_t cVar5;
  int iVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  undefined7 in_register_00000009;
  long lVar9;
  long lVar10;
  ConcatStringBuilder *current;
  StringCopyInfo local_68;
  StringCopyInfoStack *local_50;
  uint local_44;
  undefined8 local_40;
  char16 *local_38;
  
  local_40 = CONCAT71(in_register_00000009,recursionDepth);
  local_50 = nestedStringTreeCopyInfos;
  local_38 = buffer;
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x1da,"(!this->IsFinalized())","!this->IsFinalized()");
    if (!bVar2) goto LAB_00b3d336;
    *puVar8 = 0;
  }
  if (local_38 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x1db,"(buffer)","buffer");
    if (!bVar2) {
LAB_00b3d336:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  cVar3 = JavascriptString::GetLength((JavascriptString *)this);
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_44 = (int)local_40 + 1U & 0xff;
  do {
    uVar4 = this->m_count - 1;
    if (-1 < (int)uVar4) {
      lVar9 = (ulong)uVar4 + 1;
      do {
        this_00 = (this->m_slots).ptr[lVar9 + -1].ptr;
        if (this_00 != (JavascriptString *)0x0) {
          cVar5 = JavascriptString::GetLength(this_00);
          bVar2 = cVar3 < cVar5;
          cVar3 = cVar3 - cVar5;
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                        ,0x1e9,"(remainingCharLengthToCopy >= copyCharLength)",
                                        "remainingCharLengthToCopy >= copyCharLength");
            if (!bVar2) goto LAB_00b3d336;
            *puVar8 = 0;
          }
          if ((byte)local_40 == '\x03') {
            iVar6 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(this_00);
            if ((char)iVar6 != '\0') {
              StringCopyInfo::StringCopyInfo(&local_68,this_00,local_38 + cVar3);
              copyInfo.destinationBuffer = local_68.destinationBuffer;
              copyInfo.sourceString = local_68.sourceString;
              copyInfo.isInitialized = local_68.isInitialized;
              copyInfo._17_7_ = local_68._17_7_;
              StringCopyInfoStack::Push(local_50,copyInfo);
              goto LAB_00b3d310;
            }
          }
          if (3 < (byte)local_40) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                        ,500,"(recursionDepth <= MaxCopyRecursionDepth)",
                                        "recursionDepth <= MaxCopyRecursionDepth");
            if (!bVar2) goto LAB_00b3d336;
            *puVar8 = 0;
          }
          JavascriptString::Copy(this_00,local_38 + cVar3,local_50,(byte)local_44);
        }
LAB_00b3d310:
        lVar10 = lVar9 + -1;
        bVar2 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar2);
    }
    this = (this->m_prevChunk).ptr;
    if (this == (ConcatStringBuilder *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void ConcatStringBuilder::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(!this->IsFinalized());
        Assert(buffer);

        CharCount remainingCharLengthToCopy = GetLength();
        for(const ConcatStringBuilder *current = this; current; current = current->m_prevChunk)
        {
            for(int i = current->m_count - 1; i >= 0; --i)
            {
                JavascriptString *const s = current->m_slots[i];
                if(!s)
                {
                    continue;
                }

                const CharCount copyCharLength = s->GetLength();
                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
                {
                    // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                    // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                    // the caller can deal with those after returning.
                    nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[remainingCharLengthToCopy]));
                }
                else
                {
                    Assert(recursionDepth <= MaxCopyRecursionDepth);
                    s->Copy(&buffer[remainingCharLengthToCopy], nestedStringTreeCopyInfos, recursionDepth + 1);
                }
            }
        }
    }